

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

void __thiscall QTextDocument::setHtml(QTextDocument *this,QString *html)

{
  bool enable;
  QTextDocumentPrivate *this_00;
  long in_FS_OFFSET;
  QTextHtmlImporter QStack_128;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextDocumentPrivate **)&this->field_0x8;
  enable = this_00->undoEnabled;
  QTextDocumentPrivate::enableUndoRedo(this_00,false);
  QTextDocumentPrivate::beginEditBlock(this_00);
  QTextDocumentPrivate::clear(this_00);
  QTextHtmlImporter::QTextHtmlImporter(&QStack_128,this,html,ImportToDocument,(QTextDocument *)0x0);
  QTextHtmlImporter::import(&QStack_128);
  QTextHtmlImporter::~QTextHtmlImporter(&QStack_128);
  QTextDocumentPrivate::endEditBlock(this_00);
  QTextDocumentPrivate::enableUndoRedo(this_00,enable);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::setHtml(const QString &html)
{
    Q_D(QTextDocument);
    bool previousState = d->isUndoRedoEnabled();
    d->enableUndoRedo(false);
    d->beginEditBlock();
    d->clear();
    // ctor calls parse() to build up QTextHtmlParser::nodes list
    // then import() populates the QTextDocument from those
    QTextHtmlImporter(this, html, QTextHtmlImporter::ImportToDocument).import();
    d->endEditBlock();
    d->enableUndoRedo(previousState);
}